

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

Function * __thiscall
soul::PoolAllocator::allocate<soul::AST::Function,soul::AST::Context&>
          (PoolAllocator *this,Context *args)

{
  SourceCodeText *pSVar1;
  Scope *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0xe0);
  *(undefined4 *)&pPVar3->field_0x18 = 3;
  pSVar1 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = args->parentScope;
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = pSVar2;
  pPVar3->item = &PTR__Function_002cc488;
  *(undefined ***)&pPVar3[1].field_0x18 = &PTR__Function_002cc4c8;
  pPVar3[2].size = 0;
  pPVar3[2].destructor = (DestructorFn *)0x0;
  pPVar3[2].item = (void *)0x0;
  *(undefined8 *)&pPVar3[2].field_0x18 = 0;
  pPVar3[3].destructor = (DestructorFn *)0x0;
  pPVar3[3].item = (void *)0x0;
  *(undefined8 *)&pPVar3[3].field_0x18 = 0;
  pPVar3[4].size = 0;
  pPVar3[4].destructor = (DestructorFn *)0x0;
  pPVar3[4].item = (void *)0x0;
  *(undefined8 *)&pPVar3[4].field_0x18 = 0;
  pPVar3[5].size = 0;
  pPVar3[5].destructor = (DestructorFn *)0x0;
  pPVar3[5].item = (void *)0x0;
  *(undefined8 *)&pPVar3[5].field_0x18 = 0;
  pPVar3[6].size = 0;
  pPVar3[6].destructor = (DestructorFn *)0x0;
  pPVar3[6].item = (void *)0x0;
  *(undefined8 *)((long)&pPVar3[6].item + 5) = 0;
  pPVar3[7].size = 0;
  pPVar3[7].destructor = (DestructorFn *)0x0;
  pPVar3->destructor =
       allocate<soul::AST::Function,_soul::AST::Context_&>::anon_class_1_0_00000001::__invoke;
  return (Function *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }